

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linked-list.cpp
# Opt level: O0

void __thiscall LinkedList::prepend(LinkedList *this,Node **head,int data)

{
  Node *__s;
  Node *prev;
  int data_local;
  Node **head_local;
  LinkedList *this_local;
  
  __s = (Node *)operator_new(0x10);
  memset(__s,0,0x10);
  __s->next = (Node *)0x0;
  __s->data = data;
  if (*head == (Node *)0x0) {
    *head = __s;
  }
  else {
    __s->next = *head;
    *head = __s;
  }
  return;
}

Assistant:

void LinkedList::prepend(Node** head, int data) {
	// Allocate new node
	Node* prev = new Node();

	// Add next node attribute
	prev->next = NULL;

	// Add data attribute
	prev->data = data;

	// if head is null
	if (*head == nullptr) {
		*head = prev;
		return;
	}

	prev->next = *head;
	*head = prev;
}